

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall
pbrt::Image::MRSE(Image *this,ImageChannelDesc *desc,Image *ref,Image *mrseImage)

{
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  Point2i PVar4;
  ulong uVar5;
  size_t sVar6;
  reference pvVar7;
  reference pvVar8;
  Image *in_RCX;
  Allocator in_RSI;
  Image *in_RDI;
  long in_R8;
  float fVar9;
  Tuple2<pbrt::Point2,_int> p;
  Image *pIVar10;
  double dVar11;
  int c_1;
  Float rse;
  int c;
  ImageChannelValues vref;
  ImageChannelValues v;
  int x;
  int y;
  Point2i vb;
  Point2i va;
  ImageChannelDesc refDesc;
  vector<double,_std::allocator<double>_> sumRSE;
  ImageChannelValues *mrse;
  Image *in_stack_fffffffffffffbd8;
  Image *in_stack_fffffffffffffbe0;
  allocator_type *in_stack_fffffffffffffbe8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  ImageChannelValues *in_stack_fffffffffffffc00;
  Image *in_stack_fffffffffffffc18;
  value_type vVar12;
  char (*in_stack_fffffffffffffc20) [14];
  char (*in_stack_fffffffffffffc28) [17];
  ImageChannelDesc *in_stack_fffffffffffffc30;
  Image *in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  LogLevel level;
  char *in_stack_fffffffffffffc48;
  Float in_stack_fffffffffffffc50;
  LogLevel in_stack_fffffffffffffc54;
  char (*in_stack_fffffffffffffc60) [13];
  Point2<int> *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  value_type vVar13;
  Point2<int> *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  PixelFormat format;
  Image *this_00;
  undefined1 *puVar14;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffd20;
  int local_2d8;
  undefined4 in_stack_fffffffffffffd30;
  int iVar15;
  undefined4 in_stack_fffffffffffffd34;
  Image *in_stack_fffffffffffffd38;
  float in_stack_fffffffffffffd40;
  WrapMode in_stack_fffffffffffffd44;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffd48;
  int local_238;
  int local_230;
  int iStack_228;
  int local_224;
  Image *local_220;
  Tuple2<pbrt::Point2,_int> local_c8;
  Tuple2<pbrt::Point2,_int> local_c0 [14];
  undefined1 local_49;
  undefined8 local_48;
  vector<double,_std::allocator<double>_> local_40;
  long local_28;
  Image *local_20;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffc40 >> 0x20);
  this_00 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ImageChannelDesc::size((ImageChannelDesc *)0x4c0d3f);
  format = (PixelFormat)((ulong)in_RDI >> 0x20);
  local_48 = 0;
  puVar14 = &local_49;
  std::allocator<double>::allocator((allocator<double> *)0x4c0d68);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc00,
             CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
             (value_type_conflict4 *)in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  std::allocator<double>::~allocator((allocator<double> *)0x4c0d9c);
  pIVar10 = local_20;
  ChannelNames_abi_cxx11_(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  pstd::span<std::__cxx11::string_const>::
  span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (in_stack_fffffffffffffbf0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffbe8);
  requestedChannels.n = in_stack_fffffffffffffcc8;
  requestedChannels.ptr = in_stack_fffffffffffffcc0;
  GetChannelDesc((Image *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                 requestedChannels);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffbf0);
  bVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x4c0e21);
  if (!bVar1) {
    LogFatal<char_const(&)[14]>
              (level,(char *)in_stack_fffffffffffffc38,
               (int)((ulong)in_stack_fffffffffffffc30 >> 0x20),*in_stack_fffffffffffffc28,
               in_stack_fffffffffffffc20);
  }
  local_c0[0] = (Tuple2<pbrt::Point2,_int>)Resolution((Image *)in_RSI.memoryResource);
  local_c8 = (Tuple2<pbrt::Point2,_int>)Resolution(local_20);
  bVar1 = Tuple2<pbrt::Point2,_int>::operator==(local_c0,(Point2<int> *)&local_c8);
  if (!bVar1) {
    LogFatal<char_const(&)[13],char_const(&)[17],char_const(&)[13],pbrt::Point2<int>&,char_const(&)[17],pbrt::Point2<int>&>
              (in_stack_fffffffffffffc54,in_stack_fffffffffffffc48,level,
               (char *)in_stack_fffffffffffffc38,(char (*) [13])in_stack_fffffffffffffc30,
               in_stack_fffffffffffffc28,in_stack_fffffffffffffc60,in_stack_fffffffffffffc68,
               (char (*) [17])CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
               in_stack_fffffffffffffc78);
  }
  if (local_28 != 0) {
    Resolution((Image *)in_RSI.memoryResource);
    ChannelNames_abi_cxx11_(in_stack_fffffffffffffc18);
    pstd::span<std::__cxx11::string_const>::
    span<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (in_stack_fffffffffffffbf0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffbe8);
    ColorEncodingHandle::TaggedPointer
              ((ColorEncodingHandle *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffbe0);
    channels.n = (size_t)puVar14;
    channels.ptr = pbVar3;
    Image(this_00,format,(Point2i)in_stack_fffffffffffffd20,channels,(ColorEncodingHandle *)pIVar10,
          in_RSI);
    operator=(in_stack_fffffffffffffbe0,local_220);
    ~Image(in_stack_fffffffffffffbe0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbf0);
    in_stack_fffffffffffffbd8 = local_220;
  }
  local_224 = 0;
  while( true ) {
    iVar15 = local_224;
    PVar4 = Resolution((Image *)in_RSI.memoryResource);
    iStack_228 = PVar4.super_Tuple2<pbrt::Point2,_int>.y;
    if (iStack_228 <= iVar15) break;
    local_230 = 0;
    while( true ) {
      PVar4 = Resolution((Image *)in_RSI.memoryResource);
      local_238 = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
      if (local_238 <= local_230) break;
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffbe0,
                          (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                          (int)in_stack_fffffffffffffbd8);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffbf0,
                 (WrapMode)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      wrapMode.wrap.values[1] = in_stack_fffffffffffffd44;
      wrapMode.wrap.values[0] = (WrapMode)in_stack_fffffffffffffd40;
      GetChannels(in_stack_fffffffffffffd38,(Point2i)in_stack_fffffffffffffd48,
                  (ImageChannelDesc *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  wrapMode);
      Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffbe0,
                          (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                          (int)in_stack_fffffffffffffbd8);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)in_stack_fffffffffffffbf0,
                 (WrapMode)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      wrapMode_00.wrap.values[1] = in_stack_fffffffffffffd44;
      wrapMode_00.wrap.values[0] = (WrapMode)in_stack_fffffffffffffd40;
      GetChannels(in_stack_fffffffffffffd38,(Point2i)in_stack_fffffffffffffd48,
                  (ImageChannelDesc *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                  wrapMode_00);
      for (in_stack_fffffffffffffd44 = Repeat; uVar5 = (ulong)(int)in_stack_fffffffffffffd44,
          sVar6 = ImageChannelDesc::size((ImageChannelDesc *)0x4c129b), uVar5 < sVar6;
          in_stack_fffffffffffffd44 = in_stack_fffffffffffffd44 + Black) {
        pvVar7 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
        vVar13 = *pvVar7;
        pvVar7 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
        fVar9 = Sqr<float>(vVar13 - *pvVar7);
        p = (Tuple2<pbrt::Point2,_int>)(double)fVar9;
        pvVar7 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
        pIVar10 = (Image *)Sqr<double>((double)*pvVar7 + 0.01);
        in_stack_fffffffffffffd40 = (float)((double)p / (double)pIVar10);
        uVar2 = std::isinf((double)(ulong)(uint)in_stack_fffffffffffffd40);
        in_stack_fffffffffffffc54 = CONCAT13((char)uVar2,(int3)in_stack_fffffffffffffc54);
        if ((uVar2 & 1) == 0) {
          dVar11 = (double)in_stack_fffffffffffffd40;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_40,(long)(int)in_stack_fffffffffffffd44);
          *pvVar8 = dVar11 + *pvVar8;
          if (local_28 != 0) {
            Point2<int>::Point2((Point2<int> *)in_stack_fffffffffffffbe0,
                                (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20),
                                (int)in_stack_fffffffffffffbd8);
            SetChannel(pIVar10,(Point2i)p,in_stack_fffffffffffffc54,in_stack_fffffffffffffc50);
          }
        }
      }
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x4c14d6);
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x4c14e3);
      local_230 = local_230 + 1;
    }
    local_224 = local_224 + 1;
  }
  ImageChannelDesc::size((ImageChannelDesc *)0x4c1538);
  ImageChannelValues::ImageChannelValues
            (in_stack_fffffffffffffc00,CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8)
             ,(Float)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
  iVar15 = 0;
  while( true ) {
    uVar5 = (ulong)iVar15;
    sVar6 = ImageChannelDesc::size((ImageChannelDesc *)0x4c157c);
    if (sVar6 <= uVar5) break;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar15);
    vVar12 = *pvVar8;
    PVar4 = Resolution((Image *)in_RSI.memoryResource);
    local_2d8 = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
    PVar4 = Resolution((Image *)in_RSI.memoryResource);
    fVar9 = (float)(vVar12 / (double)(local_2d8 * PVar4.super_Tuple2<pbrt::Point2,_int>.y));
    pvVar7 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
    *pvVar7 = fVar9;
    iVar15 = iVar15 + 1;
  }
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x4c16b8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffbf0);
  return (ImageChannelValues *)this_00;
}

Assistant:

ImageChannelValues Image::MRSE(const ImageChannelDesc &desc, const Image &ref,
                               Image *mrseImage) const {
    std::vector<double> sumRSE(desc.size(), 0.);

    ImageChannelDesc refDesc = ref.GetChannelDesc(ChannelNames(desc));
    CHECK((bool)refDesc);
    CHECK_EQ(Resolution(), ref.Resolution());

    if (mrseImage)
        *mrseImage = Image(PixelFormat::Float, Resolution(), ChannelNames());

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            ImageChannelValues vref = ref.GetChannels({x, y}, refDesc);

            for (int c = 0; c < desc.size(); ++c) {
                Float rse = Sqr(v[c] - vref[c]) / Sqr(vref[c] + 0.01);
                if (std::isinf(rse))
                    continue;
                sumRSE[c] += rse;
                if (mrseImage)
                    mrseImage->SetChannel({x, y}, c, rse);
            }
        }

    ImageChannelValues mrse(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        mrse[c] = sumRSE[c] / (Resolution().x * Resolution().y);
    return mrse;
}